

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall ColorPrimariesACES::ColorPrimariesACES(ColorPrimariesACES *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  ColorPrimaryTransform *in_RDI;
  ColorPrimaryTransform *inToXYZ;
  ColorPrimaries *in_stack_fffffffffffffee0;
  allocator_type *in_stack_fffffffffffffef8;
  allocator_type *__a;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff00;
  vector<float,_std::allocator<float>_> *this_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar1;
  undefined1 in_stack_ffffffffffffff0c [12];
  undefined1 local_89 [49];
  undefined1 *local_58;
  undefined8 local_50;
  
  local_89._17_8_ = 0xbd93ba3a3f3a6918;
  local_89._25_8_ = 0;
  local_89._1_8_ = 0x3f73da79;
  local_89._9_8_ = 0x3eb01c5f38c47551;
  local_89._33_4_ = 0x3f81212f;
  local_58 = local_89 + 1;
  local_50 = 9;
  inToXYZ = (ColorPrimaryTransform *)local_89;
  std::allocator<float>::allocator((allocator<float> *)0x2516b3);
  __l._4_12_ = in_stack_ffffffffffffff0c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff08;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff00,__l,in_stack_fffffffffffffef8);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&in_stack_fffffffffffffee0->toXYZ,(vector<float,_std::allocator<float>_> *)inToXYZ);
  __a = (allocator_type *)0x3dc932123fafc8b9;
  this_00 = (vector<float,_std::allocator<float>_> *)0x0;
  uVar1 = 0x3f7dc2b1;
  std::allocator<float>::allocator((allocator<float> *)0x25172f);
  __l_00._4_12_ = in_stack_ffffffffffffff0c;
  __l_00._M_array._0_4_ = uVar1;
  std::vector<float,_std::allocator<float>_>::vector(this_00,__l_00,__a);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&in_stack_fffffffffffffee0->toXYZ,(vector<float,_std::allocator<float>_> *)inToXYZ);
  ColorPrimaries::ColorPrimaries(in_stack_fffffffffffffee0,inToXYZ,in_RDI);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x251785);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x25179f);
  return;
}

Assistant:

ColorPrimariesACES() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.9525523959f,  0.0000000000f, +0.0000936786f,
            +0.3439664498f, +0.7281660966f, -0.0721325464f,
             0.0000000000f,  0.0000000000f, +1.0088251844f
        }),
        ColorPrimaryTransform({
            +1.0498110175f,  0.0000000000f, -0.0000974845f,
            -0.4959030231f, +1.3733130458f, +0.0982400361f,
             0.0000000000f,  0.0000000000f, +0.9912520182f
        })
    ) {}